

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

bool units::cleanUnitStringPhase2(string *unit_string)

{
  size_type sVar1;
  ulong uVar2;
  ulong __pos;
  ulong uVar3;
  bool bVar4;
  void *pvVar5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var6;
  size_t __n;
  pointer __s;
  pointer pcVar7;
  undefined1 local_29;
  
  sVar1 = unit_string->_M_string_length;
  bVar4 = bracketModifiers(unit_string);
  if (unit_string->_M_string_length == 0) {
    uVar3 = 0xffffffffffffffff;
  }
  else {
    pcVar7 = (unit_string->_M_dataplus)._M_p;
    pvVar5 = memchr(pcVar7,0x2d,unit_string->_M_string_length);
    uVar3 = -(ulong)(pvVar5 == (void *)0x0) | (long)pvVar5 - (long)pcVar7;
  }
joined_r0x003b454b:
  do {
    __pos = uVar3;
    if (__pos == 0xffffffffffffffff) {
      _Var6._M_current = (unit_string->_M_dataplus)._M_p;
      local_29 = 0x2b;
      _Var6 = std::
              __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                        (_Var6,_Var6._M_current + unit_string->_M_string_length,
                         (_Iter_equals_val<const_char>)&local_29);
      unit_string->_M_string_length = (long)_Var6._M_current - (long)(unit_string->_M_dataplus)._M_p
      ;
      *_Var6._M_current = '\0';
      clearEmptySegments(unit_string);
      return bVar4 || sVar1 != unit_string->_M_string_length;
    }
    uVar2 = unit_string->_M_string_length;
    if ((uVar2 - 1 <= __pos) ||
       (pcVar7 = (unit_string->_M_dataplus)._M_p, 9 < (byte)(pcVar7[__pos + 1] - 0x30U)))
    goto LAB_003b4585;
    __n = uVar2 - (__pos + 1);
    uVar3 = 0xffffffffffffffff;
  } while (uVar2 < __pos + 1 || __n == 0);
  __s = pcVar7 + __pos + 1;
  goto LAB_003b45ae;
LAB_003b4585:
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)unit_string,__pos,
             1);
  __n = unit_string->_M_string_length - __pos;
  uVar3 = 0xffffffffffffffff;
  if (__pos <= unit_string->_M_string_length && __n != 0) {
    pcVar7 = (unit_string->_M_dataplus)._M_p;
    __s = pcVar7 + __pos;
LAB_003b45ae:
    pvVar5 = memchr(__s,0x2d,__n);
    uVar3 = -(ulong)(pvVar5 == (void *)0x0) | (long)pvVar5 - (long)pcVar7;
  }
  goto joined_r0x003b454b;
}

Assistant:

static bool cleanUnitStringPhase2(std::string& unit_string)
{
    bool changed{false};
    auto len = unit_string.length();

    if (bracketModifiers(unit_string)) {
        changed = true;
    }

    // cleanup extraneous dashes
    auto dpos = unit_string.find_first_of('-');
    while (dpos != std::string::npos) {
        if (dpos < unit_string.size() - 1) {
            if (unit_string[dpos + 1] >= '0' && unit_string[dpos + 1] <= '9') {
                dpos = unit_string.find_first_of('-', dpos + 1);
                continue;
            }
        }

        unit_string.erase(dpos, 1);
        dpos = unit_string.find_first_of('-', dpos);
    }
    unit_string.erase(
        std::remove(unit_string.begin(), unit_string.end(), '+'),
        unit_string.end());

    clearEmptySegments(unit_string);

    return changed || (len != unit_string.length());
}